

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O3

void __thiscall
SphericalTriangleArea_RandomSampling_Test::TestBody(SphericalTriangleArea_RandomSampling_Test *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  byte bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  bool bVar11;
  int iVar12;
  ulong uVar13;
  uint64_t oldstate_1;
  char *message;
  int iVar14;
  uint64_t oldstate;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar24 [16];
  float fVar21;
  Float FVar22;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar23 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar28 [32];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  Vector3f a;
  Vector3f b;
  Vector3f c;
  Point3f p0;
  Point3f p1;
  Point3f p2;
  Hammersley2DIter __begin2;
  Float error;
  AssertionResult gtest_ar;
  aligned_storage_t<sizeof(pbrt::TriangleIntersection),_alignof(pbrt::TriangleIntersection)>
  local_1c0;
  byte local_1b0;
  float local_1ac;
  undefined1 local_1a8 [16];
  AssertHelper local_190;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  float local_150;
  float local_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_110 [12];
  float fStack_104;
  float fStack_100;
  float local_fc;
  Float local_f8;
  MediumHandle local_f0;
  float local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  long local_b0;
  Tuple3<pbrt::Vector3,_float> local_a8;
  Tuple3<pbrt::Vector3,_float> local_98;
  Tuple3<pbrt::Vector3,_float> local_88;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [56];
  
  local_b0 = 0;
  do {
    auVar20 = local_148;
    uVar13 = ((ulong)(local_b0 * 0x7fb5d329728ea185) >> 0x1b ^ local_b0 * 0x7fb5d329728ea185) *
             -0x7e25210b43d22bb3;
    uVar13 = ((uVar13 >> 0x21 ^ uVar13) + 1) * 0x5851f42d4c957f2d + local_b0 * -0x4f5c17a566d501a4 +
             1;
    uVar1 = uVar13 * 0x5851f42d4c957f2d + 1 + local_b0 * 2;
    uVar2 = uVar1 * 0x5851f42d4c957f2d + 1 + local_b0 * 2;
    uVar3 = uVar2 * 0x5851f42d4c957f2d + 1 + local_b0 * 2;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar1;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar3;
    auVar16 = vpunpcklqdq_avx(auVar33,auVar19);
    uVar1 = uVar3 * 0x5851f42d4c957f2d + 1 + local_b0 * 2;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar1 * 0x5851f42d4c957f2d + 1 + local_b0 * 2;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar1;
    auVar17 = vpunpcklqdq_avx(auVar34,auVar38);
    auVar5 = vpmovsxbq_avx2(ZEXT416(0x2d1b2d1b));
    auVar28._0_16_ = ZEXT116(0) * auVar16 + ZEXT116(1) * auVar17;
    auVar28._16_16_ = ZEXT116(1) * auVar16;
    auVar6 = vpmovsxbq_avx2(ZEXT416(0x1b2d1b2d));
    auVar5 = vpsrlvq_avx2(auVar28,auVar5);
    auVar6 = vpsrlvq_avx2(auVar28,auVar6);
    auVar28 = vpsrlq_avx2(auVar28,0x3b);
    auVar16 = vpmovqd_avx512vl(auVar28);
    auVar17 = vpmovqd_avx512vl(auVar5 ^ auVar6);
    auVar16 = vprorvd_avx512vl(auVar17,auVar16);
    auVar16 = vcvtudq2ps_avx512vl(auVar16);
    local_188._0_4_ = auVar16._0_4_ * 2.3283064e-10;
    local_188._4_4_ = auVar16._4_4_ * 2.3283064e-10;
    local_188._8_4_ = auVar16._8_4_ * 2.3283064e-10;
    local_188._12_4_ = auVar16._12_4_ * 2.3283064e-10;
    auVar23._8_4_ = 0x3f7fffff;
    auVar23._0_8_ = 0x3f7fffff3f7fffff;
    auVar23._12_4_ = 0x3f7fffff;
    uVar1 = vcmpps_avx512vl(local_188,auVar23,1);
    auVar16 = vshufps_avx(local_188,local_188,0xff);
    local_138._0_2_ = (short)uVar1;
    local_128._0_2_ = (ushort)(uVar1 >> 1) & 0x7f;
    bVar7 = (byte)uVar1 >> 3;
    local_148[1] = 0;
    local_148[0] = (byte)uVar1 >> 2;
    local_148._2_14_ = auVar20._2_14_;
    fVar15 = (float)((uint)(bVar7 & 1) * (int)(auVar16._0_4_ * 6.2831855) +
                    (uint)!(bool)(bVar7 & 1) * 0x40c90fda);
    local_168 = ZEXT416((uint)fVar15);
    local_c8._0_4_ = cosf(fVar15);
    local_c8._4_4_ = extraout_XMM0_Db;
    local_c8._8_4_ = extraout_XMM0_Dc;
    local_c8._12_4_ = extraout_XMM0_Dd;
    local_d8._0_4_ = sinf((float)local_168._0_4_);
    local_d8._4_4_ = extraout_XMM0_Db_00;
    local_d8._8_4_ = extraout_XMM0_Dc_00;
    local_d8._12_4_ = extraout_XMM0_Dd_00;
    auVar5 = vpmovsxbq_avx2(ZEXT416(0x1b2d1b2d));
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar13;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar2;
    auVar16 = vpunpcklqdq_avx(auVar18,auVar35);
    auVar6 = vpmovsxbq_avx2(ZEXT416(0x2d1b2d1b));
    auVar17 = vpsrlvq_avx2(auVar16,auVar5._0_16_);
    auVar20 = vpsrlvq_avx2(auVar16,auVar6._0_16_);
    auVar16 = vpsrlq_avx(auVar16,0x3b);
    auVar16 = vpshufd_avx(auVar16,0xe8);
    auVar17 = vpshufd_avx(auVar20 ^ auVar17,0xe8);
    auVar16 = vprorvd_avx512vl(auVar17,auVar16);
    auVar17 = vcvtudq2ps_avx512vl(auVar16);
    auVar16._8_4_ = 0x2f800000;
    auVar16._0_8_ = 0x2f8000002f800000;
    auVar16._12_4_ = 0x2f800000;
    auVar16 = vmulps_avx512vl(auVar17,auVar16);
    auVar17._8_4_ = 0x3f7fffff;
    auVar17._0_8_ = 0x3f7fffff3f7fffff;
    auVar17._12_4_ = 0x3f7fffff;
    local_168 = vminps_avx512vl(auVar16,auVar17);
    auVar16 = vpermilpd_avx(local_188,1);
    fVar15 = (float)((uint)(local_148[0] & 1) * (int)(auVar16._0_4_ * 6.2831855) +
                    (uint)!(bool)(local_148[0] & 1) * 0x40c90fda);
    local_1a8 = ZEXT416((uint)fVar15);
    local_148._0_4_ = cosf(fVar15);
    local_148._4_4_ = extraout_XMM0_Db_01;
    local_148._8_4_ = extraout_XMM0_Dc_01;
    local_148._12_4_ = extraout_XMM0_Dd_01;
    local_1a8._0_4_ = sinf((float)local_1a8._0_4_);
    local_1a8._4_4_ = extraout_XMM0_Db_02;
    local_1a8._8_4_ = extraout_XMM0_Dc_02;
    local_1a8._12_4_ = extraout_XMM0_Dd_02;
    auVar16 = vmovshdup_avx(local_188);
    fVar15 = local_188._0_4_;
    auVar40._8_4_ = 0x3f800000;
    auVar40._0_8_ = 0x3f8000003f800000;
    auVar40._12_4_ = 0x3f800000;
    local_128 = vfmadd132ss_fma(ZEXT416((uint)(local_128[0] & 1) * auVar16._0_4_ +
                                        (uint)!(bool)(local_128[0] & 1) * 0x3f7fffff),auVar40,
                                ZEXT416(0xc0000000));
    auVar16 = vfnmadd213ss_fma(local_128,local_128,auVar40);
    auVar16 = vmaxss_avx(auVar16,ZEXT416(0));
    local_188 = vsqrtss_avx(auVar16,auVar16);
    fVar15 = (float)((uint)(local_138[0] & 1) * (int)(fVar15 * 6.2831855) +
                    (uint)!(bool)(local_138[0] & 1) * 0x40c90fda);
    local_178 = ZEXT416((uint)fVar15);
    local_138._0_4_ = cosf(fVar15);
    local_138._4_4_ = extraout_XMM0_Db_03;
    local_138._8_4_ = extraout_XMM0_Dc_03;
    local_138._12_4_ = extraout_XMM0_Dd_03;
    auVar29._0_4_ = sinf((float)local_178._0_4_);
    auVar29._4_60_ = extraout_var;
    auVar43._8_4_ = 0x3f800000;
    auVar43._0_8_ = 0x3f8000003f800000;
    auVar43._12_4_ = 0x3f800000;
    auVar45._8_4_ = 0x80000000;
    auVar45._0_8_ = 0x8000000080000000;
    auVar45._12_4_ = 0x80000000;
    auVar20._8_4_ = 0xc0000000;
    auVar20._0_8_ = 0xc0000000c0000000;
    auVar20._12_4_ = 0xc0000000;
    local_168 = vfmadd132ps_avx512vl(local_168,auVar43,auVar20);
    local_a8.z = local_128._0_4_;
    auVar16 = vfnmadd213ps_avx512vl(local_168,local_168,auVar43);
    auVar20 = vmaxps_avx(auVar16,_DAT_0054e010);
    auVar16 = vinsertps_avx(auVar29._0_16_,ZEXT416((uint)local_138._0_4_),0x10);
    local_138 = vmovshdup_avx512vl(local_168);
    auVar17 = vinsertps_avx(local_c8,ZEXT416((uint)local_1a8._0_4_),0x10);
    auVar19 = vsqrtps_avx(auVar20);
    auVar46._0_4_ = auVar19._0_4_ * auVar17._0_4_;
    auVar46._4_4_ = auVar19._4_4_ * auVar17._4_4_;
    auVar46._8_4_ = auVar19._8_4_ * auVar17._8_4_;
    auVar46._12_4_ = auVar19._12_4_ * auVar17._12_4_;
    auVar17 = vinsertps_avx(local_d8,ZEXT416((uint)local_148._0_4_),0x10);
    auVar20 = vshufps_avx(auVar46,auVar46,0xe1);
    auVar36._0_4_ = auVar19._0_4_ * auVar17._0_4_;
    auVar36._4_4_ = auVar19._4_4_ * auVar17._4_4_;
    auVar36._8_4_ = auVar19._8_4_ * auVar17._8_4_;
    auVar36._12_4_ = auVar19._12_4_ * auVar17._12_4_;
    local_c8 = vinsertps_avx(auVar46,auVar36,0x1c);
    local_d8 = vinsertps_avx(auVar46,auVar36,0x4c);
    local_88._0_8_ = vmovlps_avx(local_c8);
    local_98._0_8_ = vmovlps_avx(local_d8);
    local_88.z = local_168._0_4_;
    local_98.z = local_138._0_4_;
    auVar47._0_4_ = (float)local_188._0_4_ * auVar16._0_4_;
    auVar47._4_4_ = (float)local_188._0_4_ * auVar16._4_4_;
    auVar47._8_4_ = (float)local_188._0_4_ * auVar16._8_4_;
    auVar47._12_4_ = (float)local_188._0_4_ * auVar16._12_4_;
    auVar16 = vaddss_avx512f(local_168,local_138);
    auVar24._0_4_ = auVar47._0_4_ + auVar36._0_4_ + auVar20._0_4_;
    auVar24._4_4_ = auVar47._4_4_ + auVar36._4_4_ + auVar20._4_4_;
    auVar24._8_4_ = auVar47._8_4_ + auVar36._8_4_ + auVar20._8_4_;
    auVar24._12_4_ = auVar47._12_4_ + auVar36._12_4_ + auVar20._12_4_;
    auVar17 = vaddss_avx512f(auVar16,local_128);
    local_148 = vshufps_avx(auVar47,auVar47,0xe1);
    local_a8._0_8_ = vmovlps_avx(local_148);
    auVar41._0_4_ = auVar24._0_4_ * auVar24._0_4_;
    auVar41._4_4_ = auVar24._4_4_ * auVar24._4_4_;
    auVar41._8_4_ = auVar24._8_4_ * auVar24._8_4_;
    auVar41._12_4_ = auVar24._12_4_ * auVar24._12_4_;
    fVar15 = auVar17._0_4_;
    auVar16 = vhaddps_avx(auVar41,auVar41);
    auVar16 = ZEXT416((uint)(fVar15 * fVar15 + auVar16._0_4_));
    auVar16 = vsqrtss_avx(auVar16,auVar16);
    fVar21 = auVar16._0_4_;
    auVar42._4_4_ = fVar21;
    auVar42._0_4_ = fVar21;
    auVar42._8_4_ = fVar21;
    auVar42._12_4_ = fVar21;
    local_58._0_4_ = fVar15 / fVar21;
    local_58._4_12_ = auVar17._4_12_;
    _local_48 = vdivps_avx(auVar24,auVar42);
    auVar18 = vpternlogd_avx512vl(auVar43,local_58,auVar45,0xf8);
    fVar21 = auVar18._0_4_;
    fVar15 = local_48._0_4_;
    auVar17 = vmovshdup_avx(_local_48);
    auVar20 = vmovshdup_avx(auVar36);
    local_150 = auVar17._0_4_;
    fVar39 = -1.0 / ((float)local_58._0_4_ + fVar21);
    auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * auVar36._0_4_)),auVar46,auVar17);
    auVar19 = vmovshdup_avx(auVar46);
    auVar16 = vinsertps_avx(_local_48,ZEXT416((uint)(local_150 * fVar21)),0x10);
    auVar44._0_4_ = fVar15 * auVar16._0_4_;
    auVar44._4_4_ = local_48._4_4_ * auVar16._4_4_;
    auVar44._8_4_ = local_48._8_4_ * auVar16._8_4_;
    auVar44._12_4_ = local_48._12_4_ * auVar16._12_4_;
    auVar20 = vfmadd213ss_fma(auVar20,auVar17,ZEXT416((uint)(auVar19._0_4_ * fVar15)));
    auVar16 = vmovshdup_avx(auVar47);
    auVar19 = vfmadd231ss_avx512f(auVar23,local_58,local_168);
    auVar16 = vfmadd213ss_fma(auVar16,auVar17,ZEXT416((uint)(auVar47._0_4_ * fVar15)));
    auVar17 = vfmadd231ss_fma(auVar20,local_58,local_138);
    auVar20 = vfmadd231ss_avx512f(auVar16,local_128,local_58);
    auVar16 = vminss_avx(auVar17,auVar19);
    auVar16 = vminss_avx(auVar20,auVar16);
    local_1ac = auVar16._0_4_;
    fVar15 = fVar15 * local_150 * fVar39;
    auVar16 = vblendps_avx(auVar18,_DAT_00553790,0xe);
    local_178 = ZEXT416((uint)fVar15);
    local_150 = -fVar21 * local_150;
    auVar37._4_4_ = fVar39;
    auVar37._0_4_ = fVar39;
    auVar37._8_4_ = fVar39;
    auVar37._12_4_ = fVar39;
    local_1a8 = ZEXT416((uint)(fVar21 * fVar15));
    _local_68 = vfmadd231ps_fma(auVar16,auVar44,auVar37);
    a.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_c8._0_8_;
    a.super_Tuple3<pbrt::Vector3,_float>.z = local_88.z;
    b.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_d8._0_8_;
    b.super_Tuple3<pbrt::Vector3,_float>.z = local_98.z;
    c.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_148._0_8_;
    c.super_Tuple3<pbrt::Vector3,_float>.z = local_a8.z;
    FVar22 = pbrt::SphericalTriangleArea(a,b,c);
    local_188._0_4_ = FVar22;
    iVar14 = 0;
    _local_78 = vinsertps_avx(local_1a8,ZEXT416((uint)local_178._0_4_),0x10);
    local_190.data_ = (AssertHelperData *)0x9c4000000000;
    do {
      auVar30._0_8_ = pbrt::detail::Hammersley2DIter::operator*((Hammersley2DIter *)&local_190);
      auVar30._8_56_ = extraout_var_02;
      auVar17 = auVar30._0_16_;
      auVar16 = vmovshdup_avx(auVar17);
      fVar15 = auVar16._0_4_;
      if ((float)local_188._0_4_ <= 3.1415927) {
        auVar16 = vfmadd231ss_fma(ZEXT416((uint)(1.0 - auVar30._0_4_)),auVar17,
                                  ZEXT416((uint)local_1ac));
        local_1a8._0_4_ = auVar16._0_4_;
        auVar16 = vmaxss_avx(ZEXT416((uint)(1.0 - (float)local_1a8._0_4_ * (float)local_1a8._0_4_)),
                             ZEXT416(0));
        fVar15 = (fVar15 + fVar15) * 3.1415927;
        auVar16 = vsqrtss_avx(auVar16,auVar16);
        local_178 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar16);
        local_e8 = cosf(fVar15);
        uStack_e4 = extraout_XMM0_Db_04;
        uStack_e0 = extraout_XMM0_Dc_04;
        uStack_dc = extraout_XMM0_Dd_04;
        auVar32._0_4_ = sinf(fVar15);
        auVar32._4_60_ = extraout_var_01;
        auVar16 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)local_1a8._0_4_));
        uVar4 = vcmpss_avx512f(ZEXT416((uint)local_1a8._0_4_),SUB6416(ZEXT464(0xbf800000),0),1);
        bVar11 = (bool)((byte)uVar4 & 1);
        auVar9._4_4_ = uStack_e4;
        auVar9._0_4_ = local_e8;
        auVar9._8_4_ = uStack_e0;
        auVar9._12_4_ = uStack_dc;
        fVar15 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * auVar16._0_4_);
        auVar16 = vinsertps_avx(auVar9,auVar32._0_16_,0x10);
        auVar26._0_4_ = (float)local_178._0_4_ * auVar16._0_4_;
        auVar26._4_4_ = (float)local_178._0_4_ * auVar16._4_4_;
        auVar26._8_4_ = (float)local_178._0_4_ * auVar16._8_4_;
        auVar26._12_4_ = (float)local_178._0_4_ * auVar16._12_4_;
        auVar17 = vshufps_avx(auVar26,auVar26,0xe1);
        auVar16 = vmovshdup_avx(auVar26);
        auVar25._0_4_ =
             (float)local_48._0_4_ * fVar15 +
             auVar26._0_4_ * (float)local_78._0_4_ + auVar17._0_4_ * (float)local_68._0_4_;
        auVar25._4_4_ =
             (float)local_48._4_4_ * fVar15 +
             auVar26._4_4_ * (float)local_78._4_4_ + auVar17._4_4_ * (float)local_68._4_4_;
        auVar25._8_4_ = fStack_40 * fVar15 + auVar26._8_4_ * fStack_70 + auVar17._8_4_ * fStack_60;
        auVar25._12_4_ =
             fStack_3c * fVar15 + auVar26._12_4_ * fStack_6c + auVar17._12_4_ * fStack_5c;
        local_fc = fVar15 * (float)local_58._0_4_ +
                   (auVar26._0_4_ * local_150 - (float)local_48._0_4_ * auVar16._0_4_);
      }
      else {
        auVar16 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar17,ZEXT416(0xc0000000));
        local_1a8._0_4_ = auVar16._0_4_;
        auVar16 = vfnmadd213ss_fma(auVar16,auVar16,SUB6416(ZEXT464(0x3f800000),0));
        auVar16 = vmaxss_avx(auVar16,ZEXT416(0));
        local_178 = vsqrtss_avx(auVar16,auVar16);
        local_e8 = cosf(fVar15 * 6.2831855);
        auVar31._0_4_ = sinf(fVar15 * 6.2831855);
        auVar31._4_60_ = extraout_var_00;
        auVar16 = vinsertps_avx(auVar31._0_16_,ZEXT416((uint)local_e8),0x10);
        auVar25._0_4_ = (float)local_178._0_4_ * auVar16._0_4_;
        auVar25._4_4_ = (float)local_178._0_4_ * auVar16._4_4_;
        auVar25._8_4_ = (float)local_178._0_4_ * auVar16._8_4_;
        auVar25._12_4_ = (float)local_178._0_4_ * auVar16._12_4_;
        local_fc = (float)local_1a8._0_4_;
      }
      auVar19 = local_c8;
      auVar20 = local_d8;
      auVar17 = local_148;
      auVar16 = vshufps_avx(auVar25,auVar25,0xe1);
      local_110._0_4_ = 0.0;
      local_110._4_4_ = 0.0;
      local_110._8_4_ = 0.0;
      uVar4 = vmovlps_avx(auVar16);
      fStack_104 = (float)uVar4;
      fStack_100 = (float)((ulong)uVar4 >> 0x20);
      local_f8 = 0.0;
      local_f0.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
               )0;
      p0.super_Tuple3<pbrt::Point3,_float>.z = (float)local_168._0_4_;
      p0.super_Tuple3<pbrt::Point3,_float>.x = (float)local_c8._0_4_;
      p0.super_Tuple3<pbrt::Point3,_float>.y = (float)local_c8._4_4_;
      p1.super_Tuple3<pbrt::Point3,_float>.z = (float)local_138._0_4_;
      p1.super_Tuple3<pbrt::Point3,_float>.x = (float)local_d8._0_4_;
      p1.super_Tuple3<pbrt::Point3,_float>.y = (float)local_d8._4_4_;
      p2.super_Tuple3<pbrt::Point3,_float>.z = (float)local_128._0_4_;
      p2.super_Tuple3<pbrt::Point3,_float>.x = (float)local_148._0_4_;
      p2.super_Tuple3<pbrt::Point3,_float>.y = (float)local_148._4_4_;
      local_148 = auVar17;
      local_d8 = auVar20;
      local_c8 = auVar19;
      pbrt::IntersectTriangle
                ((optional<pbrt::TriangleIntersection> *)&local_1c0.__align,(Ray *)local_110,
                 INFINITY,p0,p1,p2);
      iVar12 = (int)local_190.data_ + 1;
      iVar14 = iVar14 + (uint)local_1b0;
      local_190.data_._0_4_ = iVar12;
    } while (iVar12 != 40000);
    local_1c0.__align = (anon_struct_4_0_00000001_for___align)0x3d0f5c29;
    uVar4 = vcmpss_avx512f(ZEXT416((uint)local_188._0_4_),ZEXT416(0x40490fdb),0xe);
    bVar11 = (bool)((byte)uVar4 & 1);
    fVar15 = (float)iVar14 /
             (float)((uint)bVar11 * 0x4546f194 +
                    (uint)!bVar11 * (int)((1.0 / ((1.0 - local_1ac) * 6.2831855)) * 40000.0));
    local_168._0_4_ = fVar15;
    auVar27._0_4_ = (fVar15 - (float)local_188._0_4_) / (float)local_188._0_4_;
    auVar27._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar8._8_4_ = 0x7fffffff;
    auVar8._0_8_ = 0x7fffffff7fffffff;
    auVar8._12_4_ = 0x7fffffff;
    auVar16 = vandps_avx512vl(auVar27,auVar8);
    local_14c = auVar16._0_4_;
    testing::internal::CmpHelperLT<float,float>
              ((internal *)local_110,"error","0.035f",&local_14c,(float *)&local_1c0.__align);
    lVar10 = local_b0;
    if (local_110[0] == '\0') {
      testing::Message::Message((Message *)&local_1c0.__align);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(CONCAT44(local_1c0._4_4_,local_1c0.__align) + 0x10),"Area ",5);
      std::ostream::_M_insert<double>((double)(float)local_188._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(CONCAT44(local_1c0._4_4_,local_1c0.__align) + 0x10),", estimate ",0xb);
      std::ostream::_M_insert<double>((double)(float)local_168._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(CONCAT44(local_1c0._4_4_,local_1c0.__align) + 0x10),", va = ",7);
      pbrt::operator<<((ostream *)(CONCAT44(local_1c0._4_4_,local_1c0.__align) + 0x10),
                       (Vector3<float> *)&local_88);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(CONCAT44(local_1c0._4_4_,local_1c0.__align) + 0x10),", vb = ",7);
      pbrt::operator<<((ostream *)(CONCAT44(local_1c0._4_4_,local_1c0.__align) + 0x10),
                       (Vector3<float> *)&local_98);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(CONCAT44(local_1c0._4_4_,local_1c0.__align) + 0x10),", vc = ",7);
      pbrt::operator<<((ostream *)(CONCAT44(local_1c0._4_4_,local_1c0.__align) + 0x10),
                       (Vector3<float> *)&local_a8);
      message = "";
      if ((undefined8 *)CONCAT44(fStack_104,local_110._8_4_) != (undefined8 *)0x0) {
        message = *(char **)CONCAT44(fStack_104,local_110._8_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
                 ,0x227,message);
      testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1c0.__align);
      testing::internal::AssertHelper::~AssertHelper(&local_190);
      if (CONCAT44(local_1c0._4_4_,local_1c0.__align) != 0) {
        bVar11 = testing::internal::IsTrue(true);
        if ((bVar11) && ((long *)CONCAT44(local_1c0._4_4_,local_1c0.__align) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_1c0._4_4_,local_1c0.__align) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_110 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_b0 = lVar10 + 1;
  } while (local_b0 != 100);
  return;
}

Assistant:

TEST(SphericalTriangleArea, RandomSampling) {
    for (int i = 0; i < 100; ++i) {
        RNG rng(i);
        Vector3f a = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
        Vector3f b = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
        Vector3f c = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});

        Vector3f axis = Normalize(a + b + c);
        Frame frame = Frame::FromZ(axis);
        Float cosTheta = std::min({Dot(a, axis), Dot(b, axis), Dot(c, axis)});

        Float area = SphericalTriangleArea(a, b, c);
        bool sampleSphere = area > Pi;
        int sqrtN = 200;
        int count = 0;
        for (Point2f u : Hammersley2D(sqrtN * sqrtN)) {
            Vector3f v;
            if (sampleSphere)
                v = SampleUniformSphere(u);
            else {
                v = SampleUniformCone(u, cosTheta);
                v = frame.FromLocal(v);
            }

            if (IntersectTriangle(Ray(Point3f(0, 0, 0), v), Infinity, Point3f(a),
                                  Point3f(b), Point3f(c)))
                ++count;
        }

        Float pdf = sampleSphere ? UniformSpherePDF() : UniformConePDF(cosTheta);
        Float estA = Float(count) / (sqrtN * sqrtN * pdf);

        Float error = std::abs((estA - area) / area);
        EXPECT_LT(error, 0.035f) << "Area " << area << ", estimate " << estA
                                 << ", va = " << a << ", vb = " << b << ", vc = " << c;
    }
}